

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

_Bool SaveFileData(char *fileName,void *data,uint bytesToWrite)

{
  int iVar1;
  FILE *__s;
  size_t sVar2;
  int result;
  uint count;
  FILE *file;
  _Bool success;
  uint bytesToWrite_local;
  void *data_local;
  char *fileName_local;
  
  fileName_local._7_1_ = false;
  if (fileName == (char *)0x0) {
    TraceLog(4,"FILEIO: File name provided is not valid");
  }
  else if (saveFileData == (SaveFileDataCallback)0x0) {
    __s = fopen(fileName,"wb");
    if (__s == (FILE *)0x0) {
      TraceLog(4,"FILEIO: [%s] Failed to open file",fileName);
    }
    else {
      sVar2 = fwrite(data,1,(ulong)bytesToWrite,__s);
      if ((uint)sVar2 == 0) {
        TraceLog(4,"FILEIO: [%s] Failed to write file",fileName);
      }
      else if ((uint)sVar2 == bytesToWrite) {
        TraceLog(3,"FILEIO: [%s] File saved successfully",fileName);
      }
      else {
        TraceLog(4,"FILEIO: [%s] File partially written",fileName);
      }
      iVar1 = fclose(__s);
      fileName_local._7_1_ = iVar1 == 0;
    }
  }
  else {
    fileName_local._7_1_ = (*saveFileData)(fileName,data,bytesToWrite);
  }
  return fileName_local._7_1_;
}

Assistant:

bool SaveFileData(const char *fileName, void *data, unsigned int bytesToWrite)
{
    bool success = false;

    if (fileName != NULL)
    {
        if (saveFileData)
        {
            return saveFileData(fileName, data, bytesToWrite);
        }
#if defined(SUPPORT_STANDARD_FILEIO)
        FILE *file = fopen(fileName, "wb");

        if (file != NULL)
        {
            unsigned int count = (unsigned int)fwrite(data, sizeof(unsigned char), bytesToWrite, file);

            if (count == 0) TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to write file", fileName);
            else if (count != bytesToWrite) TRACELOG(LOG_WARNING, "FILEIO: [%s] File partially written", fileName);
            else TRACELOG(LOG_INFO, "FILEIO: [%s] File saved successfully", fileName);

            int result = fclose(file);
            if (result == 0) success = true;
        }
        else TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to open file", fileName);
#else
    TRACELOG(LOG_WARNING, "FILEIO: Standard file io not supported, use custom file callback");
#endif
    }
    else TRACELOG(LOG_WARNING, "FILEIO: File name provided is not valid");

    return success;
}